

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil.cpp
# Opt level: O0

bool QDBusUtil::isValidSignature(QString *signature)

{
  long lVar1;
  const_iterator signature_00;
  const_iterator pcVar2;
  long in_FS_OFFSET;
  char *end;
  char *data;
  QByteArray ba;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  signature_00 = QByteArray::constBegin((QByteArray *)0x23aa18);
  pcVar2 = QByteArray::constEnd((QByteArray *)0x23aa27);
  do {
    if (signature_00 == pcVar2) {
      local_21 = true;
      goto LAB_0023aa6d;
    }
    signature_00 = validateSingleType(signature_00);
  } while (signature_00 != (char *)0x0);
  local_21 = false;
LAB_0023aa6d:
  QByteArray::~QByteArray((QByteArray *)0x23aa77);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool isValidSignature(const QString &signature)
    {
        QByteArray ba = signature.toLatin1();
        const char *data = ba.constBegin();
        const char *end = ba.constEnd();
        while (data != end) {
            data = validateSingleType(data);
            if (!data)
                return false;
        }
        return true;
    }